

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O2

void printAbsBranchOperand(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  cs_struct *h;
  cs_detail *pcVar2;
  _Bool _Var3;
  uint id;
  MCOperand *pMVar4;
  int64_t iVar5;
  uint uVar6;
  
  pMVar4 = MCInst_getOperand(MI,OpNo);
  _Var3 = MCOperand_isImm(pMVar4);
  if (_Var3) {
    pMVar4 = MCInst_getOperand(MI,OpNo);
    iVar5 = MCOperand_getImm(pMVar4);
    uVar6 = (int)iVar5 * 4;
    h = MI->csh;
    id = MCInst_getOpcode(MI);
    _Var3 = PPC_abs_branch(h,id);
    if (!_Var3) {
      uVar6 = uVar6 + (int)MI->address;
    }
    SStream_concat(O,"0x%x",(ulong)uVar6);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.addr_size * 0x10 + 0x1a;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      *(uint *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.addr_size * 0x10 + 0x1e) = uVar6;
      puVar1 = &(MI->flat_insn->detail->field_6).x86.addr_size;
      *puVar1 = *puVar1 + '\x01';
    }
    return;
  }
  printOperand(MI,OpNo,O);
  return;
}

Assistant:

static void printAbsBranchOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	int imm;

	if (!MCOperand_isImm(MCInst_getOperand(MI, OpNo))) {
		printOperand(MI, OpNo, O);
		return;
	}

	imm = ((int)MCOperand_getImm(MCInst_getOperand(MI, OpNo)) << 2);

	if (!PPC_abs_branch(MI->csh, MCInst_getOpcode(MI))) {
		imm = (int)MI->address + imm;
	}

	SStream_concat(O, "0x%x", imm);

	if (MI->csh->detail) {
		MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].type = PPC_OP_IMM;
		MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].imm = imm;
		MI->flat_insn->detail->ppc.op_count++;
	}
}